

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_chroma_intra_pred_filters.c
# Opt level: O3

void ihevc_intra_pred_chroma_mode_19_to_25
               (UWORD8 *pu1_ref,WORD32 src_strd,UWORD8 *pu1_dst,WORD32 dst_strd,WORD32 nt,
               WORD32 mode)

{
  int iVar1;
  int iVar2;
  int iVar3;
  UWORD8 *pUVar4;
  uint uVar5;
  long lVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  long local_c8;
  UWORD8 aUStack_ba [4];
  byte abStack_b6 [134];
  
  iVar1 = gai4_ihevc_ang_table_chroma[mode];
  iVar3 = nt * 2;
  uVar5 = nt * 2 + 2;
  lVar6 = (long)iVar3;
  if ((int)uVar5 < 1) {
    local_c8 = (long)(iVar3 + -2);
  }
  else {
    local_c8 = lVar6 + -2;
    uVar9 = 0;
    do {
      aUStack_ba[uVar9 + lVar6] = pu1_ref[uVar9 + (long)(nt * 4)];
      aUStack_ba[(long)((int)local_c8 + 1 + (int)uVar9) + 2] = pu1_ref[uVar9 + (long)(nt * 4) + 1];
      uVar9 = uVar9 + 2;
    } while (uVar9 < uVar5);
  }
  uVar5 = iVar1 * nt >> 4;
  if ((int)uVar5 < -2) {
    iVar2 = gai4_ihevc_ang_table_chroma[(long)mode + 0x18];
    iVar8 = iVar2 + 0x80;
    lVar10 = -2;
    do {
      uVar7 = iVar8 >> 7 & 0xfffffffe;
      aUStack_ba[lVar10 + local_c8 + 2] = pu1_ref[(int)(nt * 4 - uVar7)];
      aUStack_ba[lVar10 + local_c8 + 3] = pu1_ref[(int)((nt * 4 + 1) - uVar7)];
      lVar10 = lVar10 + -2;
      iVar8 = iVar8 + iVar2;
    } while ((int)(uVar5 & 0xfffffffe) < lVar10);
  }
  if (0 < nt) {
    pUVar4 = pu1_dst + 1;
    uVar9 = 0;
    do {
      uVar9 = uVar9 + 1;
      if (0 < iVar3) {
        uVar5 = iVar1 * (int)uVar9;
        uVar7 = uVar5 & 0x1f;
        lVar10 = (int)((int)uVar5 >> 4 & 0xfffffffe) + local_c8;
        lVar11 = 0;
        do {
          pUVar4[lVar11 + -1] =
               (UWORD8)((uint)aUStack_ba[lVar11 + lVar10 + 4] * (0x20 - uVar7) +
                        aUStack_ba[lVar11 + lVar10 + 6] * uVar7 + 0x10 >> 5);
          pUVar4[lVar11] =
               (UWORD8)((uint)aUStack_ba[lVar11 + lVar10 + 5] * (0x20 - uVar7) +
                        aUStack_ba[lVar11 + lVar10 + 7] * uVar7 + 0x10 >> 5);
          lVar11 = lVar11 + 2;
        } while (lVar11 < lVar6);
      }
      pUVar4 = pUVar4 + dst_strd;
    } while (uVar9 != (uint)nt);
  }
  return;
}

Assistant:

void ihevc_intra_pred_chroma_mode_19_to_25(UWORD8 *pu1_ref,
                                           WORD32 src_strd,
                                           UWORD8 *pu1_dst,
                                           WORD32 dst_strd,
                                           WORD32 nt,
                                           WORD32 mode)
{

    WORD32 row, col, k;
    WORD32 intra_pred_ang, idx;
    WORD32 inv_ang, inv_ang_sum, pos, fract;
    WORD32 ref_main_idx_u, ref_main_idx_v, ref_idx;
    UWORD8 ref_temp[(2 * MAX_CU_SIZE) + 2];
    UWORD8 *ref_main;
    UNUSED(src_strd);


    intra_pred_ang = gai4_ihevc_ang_table_chroma[mode];
    inv_ang = gai4_ihevc_inv_ang_table_chroma[mode - 12];

    /* Intermediate reference samples for negative angle modes */
    /* This have to be removed during optimization*/
    /* For horizontal modes, (ref main = ref above) (ref side = ref left) */
    ref_main = ref_temp + 2 * nt;
    for(k = 0; k < (2 * (nt + 1)); k += 2)
    {
        ref_temp[k + (2 * (nt - 1))] = pu1_ref[(4 * nt) + k];
        ref_temp[k + 1 + (2 * (nt - 1))] = pu1_ref[(4 * nt) + k + 1];
    }


    ref_idx = (nt * intra_pred_ang) >> 5;
    inv_ang_sum = 128;
    ref_main = ref_temp + (2 * (nt - 1));
    /* SIMD Optimization can be done using look-up table for the loop */
    /* For negative angled derive the main reference samples from side */
    /*  reference samples refer to section 8.4.4.2.6 */
    for(k = -2; k > (2 * ref_idx); k -= 2)
    {
        inv_ang_sum += inv_ang;
        ref_main[k] = pu1_ref[(4 * nt) - (inv_ang_sum >> 8) * 2];
        ref_main[k + 1] = pu1_ref[((4 * nt) + 1) - (inv_ang_sum >> 8) * 2];
    }

    for(row = 0; row < nt; row++)
    {
        pos = ((row + 1) * intra_pred_ang);
        idx = pos >> 5;
        fract = pos & (31);

        // Do linear filtering
        for(col = 0; col < (2 * nt); col += 2)
        {
            ref_main_idx_u = col + 2 * idx + 2;
            ref_main_idx_v = (col + 1) + 2 * idx + 2;
            pu1_dst[(row * dst_strd) + col] = (UWORD8)(((32 - fract)
                            * ref_main[ref_main_idx_u]
                            + fract * ref_main[ref_main_idx_u + 2] + 16) >> 5);
            pu1_dst[(row * dst_strd) + (col + 1)] = (UWORD8)(((32 - fract)
                            * ref_main[ref_main_idx_v]
                            + fract * ref_main[ref_main_idx_v + 2] + 16) >> 5);

        }

    }

}